

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O1

int io_tmpfile(lua_State *L)

{
  int iVar1;
  undefined8 *puVar2;
  int *piVar3;
  FILE *pFVar4;
  
  puVar2 = (undefined8 *)lua_newuserdatauv(L,0x10,0);
  puVar2[1] = 0;
  luaL_setmetatable(L,"FILE*");
  *puVar2 = 0;
  puVar2[1] = io_fclose;
  piVar3 = __errno_location();
  *piVar3 = 0;
  pFVar4 = tmpfile64();
  *puVar2 = pFVar4;
  if (pFVar4 != (FILE *)0x0) {
    return 1;
  }
  iVar1 = luaL_fileresult(L,0,(char *)0x0);
  return iVar1;
}

Assistant:

static int io_tmpfile (lua_State *L) {
  LStream *p = newfile(L);
  errno = 0;
  p->f = tmpfile();
  return (p->f == NULL) ? luaL_fileresult(L, 0, NULL) : 1;
}